

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintStats(Gia_Man_t *p,Gps_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *__ptr;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  int level;
  int iVar15;
  Gia_Man_t *pGVar16;
  float fVar17;
  double dVar18;
  
  pVVar3 = p->vLevels;
  if (pPars == (Gps_Par_t *)0x0) {
LAB_00218c40:
    if (p->pName != (char *)0x0) {
      Abc_Print((int)p,"%s%-8s%s : ","\x1b[1;37m",p->pName,"\x1b[0m");
    }
  }
  else {
    if (pPars->fMiter != 0) {
      Gia_ManPrintStatsMiter(p,(int)pPars);
      return;
    }
    if (pPars->fNoColor == 0) goto LAB_00218c40;
    if (p->pName != (char *)0x0) {
      Abc_Print((int)p,"%-8s : ");
    }
  }
  iVar9 = p->vCis->nSize;
  iVar15 = p->nRegs;
  iVar5 = Gia_ManBoxCiNum(p);
  iVar6 = Gia_ManRegBoxNum(p);
  iVar1 = p->vCos->nSize;
  iVar2 = p->nRegs;
  iVar7 = Gia_ManBoxCoNum(p);
  pGVar16 = p;
  iVar8 = Gia_ManRegBoxNum(p);
  level = (int)pGVar16;
  Abc_Print(level,"i/o =%7d/%7d",(ulong)(uint)(iVar9 - (iVar6 + iVar5 + iVar15)),
            (ulong)(uint)(iVar1 - (iVar8 + iVar7 + iVar2)));
  if (p->nConstrs != 0) {
    Abc_Print(level,"(c=%d)");
  }
  if (p->nRegs != 0) {
    Abc_Print(level,"  ff =%7d");
  }
  pGVar16 = p;
  iVar9 = Gia_ManRegBoxNum(p);
  iVar15 = (int)pGVar16;
  if (iVar9 != 0) {
    uVar10 = Gia_ManRegBoxNum(p);
    pGVar16 = p;
    uVar11 = Gia_ManClockDomainNum(p);
    iVar15 = (int)pGVar16;
    Abc_Print(iVar15,"  boxff =%d(%d)",(ulong)uVar10,(ulong)uVar11);
  }
  if ((pPars == (Gps_Par_t *)0x0) || (pPars->fNoColor == 0)) {
    pcVar12 = "nod";
    if (p->pMuxes == (uint *)0x0) {
      pcVar12 = "and";
    }
    Abc_Print(iVar15,"  %s%s =%8d%s","\x1b[1;36m",pcVar12,
              (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),"\x1b[0m");
    pGVar16 = p;
    uVar10 = Gia_ManLevelNum(p);
    Abc_Print((int)pGVar16,"  %slev =%5d%s","\x1b[1;35m",(ulong)uVar10,"\x1b[0m");
    pGVar16 = p;
    fVar17 = Gia_ManLevelAve(p);
    Abc_Print((int)pGVar16," %s(%.2f)%s",(double)fVar17,"\x1b[1;35m");
  }
  else {
    pcVar12 = "nod";
    if (p->pMuxes == (uint *)0x0) {
      pcVar12 = "and";
    }
    Abc_Print(iVar15,"  %s =%8d",pcVar12);
    pGVar16 = p;
    uVar10 = Gia_ManLevelNum(p);
    Abc_Print((int)pGVar16,"  lev =%5d",(ulong)uVar10);
    pGVar16 = p;
    fVar17 = Gia_ManLevelAve(p);
    Abc_Print((int)pGVar16," (%.2f)",(double)fVar17);
  }
  if ((pVVar3 == (Vec_Int_t *)0x0) && (p->vLevels != (Vec_Int_t *)0x0)) {
    __ptr = p->vLevels->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      p->vLevels->pArray = (int *)0x0;
    }
    if (p->vLevels != (Vec_Int_t *)0x0) {
      free(p->vLevels);
      p->vLevels = (Vec_Int_t *)0x0;
    }
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fCut != 0)) {
    uVar10 = Gia_ManCrossCut(p,0);
    pGVar16 = p;
    Gia_ManCrossCut(p,1);
    Abc_Print((int)pGVar16,"  cut = %d(%d)",(ulong)uVar10);
  }
  pGVar16 = p;
  dVar18 = Gia_ManMemory(p);
  uVar10 = (uint)pGVar16;
  Abc_Print(uVar10,"  mem =%5.2f MB",dVar18 * 9.5367431640625e-07);
  if (p->pSibls != (int *)0x0) {
    if ((long)p->nObjs < 1) {
      uVar13 = 0;
    }
    else {
      lVar14 = 0;
      uVar13 = 0;
      do {
        bVar4 = 0 < p->pSibls[lVar14];
        uVar10 = (uint)bVar4;
        uVar13 = (ulong)((int)uVar13 + (uint)bVar4);
        lVar14 = lVar14 + 1;
      } while (p->nObjs != lVar14);
    }
    Abc_Print(uVar10,"  ch =%5d",uVar13);
  }
  if (p->pManTime != (void *)0x0) {
    pGVar16 = p;
    uVar11 = Gia_ManNonRegBoxNum(p);
    uVar10 = (uint)pGVar16;
    Abc_Print(uVar10,"  box = %d",(ulong)uVar11);
  }
  if (p->pManTime != (void *)0x0) {
    pGVar16 = p;
    uVar11 = Gia_ManBlackBoxNum(p);
    uVar10 = (uint)pGVar16;
    Abc_Print(uVar10,"  bb = %d",(ulong)uVar11);
  }
  if (p->nBufs != 0) {
    Abc_Print(uVar10,"  buf = %d");
  }
  if ((p->nXors != 0) && (p->pMuxes == (uint *)0x0)) {
    Abc_Print(uVar10,"  xor = %d");
  }
  if (pPars != (Gps_Par_t *)0x0) {
    if (pPars->fMuxXor != 0) {
      printf("\nXOR/MUX ");
      pGVar16 = p;
      Gia_ManPrintMuxStats(p);
      uVar10 = (uint)pGVar16;
    }
    if (pPars->fSwitch != 0) {
      pGVar16 = p;
      fVar17 = Gia_ManComputeSwitching(p,0x30,0x10,0);
      uVar10 = (uint)pGVar16;
      Abc_Print(uVar10,"  power =%8.1f",(double)fVar17);
      if ((Gia_ManPrintStats::PrevSwiTotal <= 0.0) ||
         (Gia_ManPrintStats::nPiPo != p->vCos->nSize + p->vCis->nSize)) {
        if (((Gia_ManPrintStats::PrevSwiTotal == 0.0) && (!NAN(Gia_ManPrintStats::PrevSwiTotal))) ||
           (Gia_ManPrintStats::nPiPo != p->vCos->nSize + p->vCis->nSize)) {
          Gia_ManPrintStats::nPiPo = p->vCos->nSize + p->vCis->nSize;
          Gia_ManPrintStats::PrevSwiTotal = fVar17;
        }
      }
      else {
        Abc_Print(uVar10," %6.2f %%",
                  ((double)(Gia_ManPrintStats::PrevSwiTotal - fVar17) * 100.0) /
                  (double)Gia_ManPrintStats::PrevSwiTotal);
      }
    }
  }
  Abc_Print(uVar10,"\n");
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    Gia_ManEquivPrintClasses(p,0,0.0);
  }
  if (p->vMapping == (Vec_Int_t *)0x0) {
LAB_002190ce:
    if (pPars == (Gps_Par_t *)0x0) goto LAB_00219126;
    if (pPars->pDumpFile != (char *)0x0) {
      Gia_ManLogAigStats(p,pPars->pDumpFile);
    }
  }
  else {
    if (pPars == (Gps_Par_t *)0x0) {
LAB_002190f1:
      pcVar12 = (char *)0x0;
    }
    else {
      if (pPars->fSkipMap != 0) goto LAB_002190ce;
      if (pPars == (Gps_Par_t *)0x0) goto LAB_002190f1;
      pcVar12 = pPars->pDumpFile;
    }
    Gia_ManPrintMappingStats(p,pcVar12);
  }
  if ((((pPars != (Gps_Par_t *)0x0) && (pPars->fNpn != 0)) && (p->vMapping != (Vec_Int_t *)0x0)) &&
     (iVar9 = Gia_ManLutSizeMax(p), iVar9 < 5)) {
    Gia_ManPrintNpnClasses(p);
  }
LAB_00219126:
  if (p->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManPrintPackingStats(p);
  }
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    Gia_ManPrintEdges(p);
  }
  if (((pPars != (Gps_Par_t *)0x0) && (pPars->fLutProf != 0)) && (p->vMapping != (Vec_Int_t *)0x0))
  {
    Gia_ManPrintLutStats(p);
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    Gia_ManPrintPlacement(p);
  }
  Gia_ManPrintFlopClasses(p);
  Gia_ManPrintGateClasses(p);
  Gia_ManPrintObjClasses(p);
  if (p->vInitClasses != (Vec_Int_t *)0x0) {
    Gia_ManPrintInitClasses(p->vInitClasses);
  }
  Gia_ManCheckIntegrityWithBoxes(p);
  if (pPars != (Gps_Par_t *)0x0) {
    if (pPars->fTents != 0) {
      Gia_ManPrintTents(p);
    }
    if (pPars->fSlacks != 0) {
      Gia_ManDfsSlacksPrint(p);
      return;
    }
  }
  return;
}

Assistant:

void Gia_ManPrintStats( Gia_Man_t * p, Gps_Par_t * pPars )
{
    extern float Gia_ManLevelAve( Gia_Man_t * p );
    int fHaveLevels = p->vLevels != NULL;
    if ( pPars && pPars->fMiter )
    {
        Gia_ManPrintStatsMiter( p, 0 );
        return;
    }
    if ( pPars && pPars->fNoColor )
    {
        if ( p->pName )
            Abc_Print( 1, "%-8s : ", p->pName );
    }
    else
    {
#ifdef WIN32
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 15 ); // bright
    if ( p->pName )
        Abc_Print( 1, "%-8s : ", p->pName );
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 7 );  // normal
#else
    if ( p->pName )
        Abc_Print( 1, "%s%-8s%s : ", "\033[1;37m", p->pName, "\033[0m" );  // bright
#endif
    }
    Abc_Print( 1, "i/o =%7d/%7d", 
        Gia_ManPiNum(p) - Gia_ManBoxCiNum(p) - Gia_ManRegBoxNum(p), 
        Gia_ManPoNum(p) - Gia_ManBoxCoNum(p) - Gia_ManRegBoxNum(p) );
    if ( Gia_ManConstrNum(p) )
        Abc_Print( 1, "(c=%d)", Gia_ManConstrNum(p) );
    if ( Gia_ManRegNum(p) )
        Abc_Print( 1, "  ff =%7d", Gia_ManRegNum(p) );
    if ( Gia_ManRegBoxNum(p) )
        Abc_Print( 1, "  boxff =%d(%d)", Gia_ManRegBoxNum(p), Gia_ManClockDomainNum(p) );
    if ( pPars && pPars->fNoColor )
    {
        Abc_Print( 1, "  %s =%8d", p->pMuxes? "nod" : "and", Gia_ManAndNum(p) );
        Abc_Print( 1, "  lev =%5d", Gia_ManLevelNum(p) ); 
        Abc_Print( 1, " (%.2f)", Gia_ManLevelAve(p) ); 
    }
    else
    {
#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    SetConsoleTextAttribute( hConsole, 11 ); // blue
    Abc_Print( 1, "  %s =%8d", p->pMuxes? "nod" : "and", Gia_ManAndNum(p) );
    SetConsoleTextAttribute( hConsole, 13 ); // magenta
    Abc_Print( 1, "  lev =%5d", Gia_ManLevelNum(p) ); 
    Abc_Print( 1, " (%.2f)", Gia_ManLevelAve(p) ); 
    SetConsoleTextAttribute( hConsole, 7 ); // normal
    }
#else
    Abc_Print( 1, "  %s%s =%8d%s",  "\033[1;36m", p->pMuxes? "nod" : "and", Gia_ManAndNum(p), "\033[0m" ); // blue
    Abc_Print( 1, "  %slev =%5d%s", "\033[1;35m", Gia_ManLevelNum(p), "\033[0m" ); // magenta
    Abc_Print( 1, " %s(%.2f)%s",    "\033[1;35m", Gia_ManLevelAve(p), "\033[0m" ); 
#endif
    }
    if ( !fHaveLevels ) 
        Vec_IntFreeP( &p->vLevels );
    if ( pPars && pPars->fCut )
        Abc_Print( 1, "  cut = %d(%d)", Gia_ManCrossCut(p, 0), Gia_ManCrossCut(p, 1) );
    Abc_Print( 1, "  mem =%5.2f MB", Gia_ManMemory(p)/(1<<20) );
    if ( Gia_ManHasChoices(p) )
        Abc_Print( 1, "  ch =%5d", Gia_ManChoiceNum(p) );
    if ( p->pManTime )
        Abc_Print( 1, "  box = %d", Gia_ManNonRegBoxNum(p) );
    if ( p->pManTime )
        Abc_Print( 1, "  bb = %d", Gia_ManBlackBoxNum(p) );
    if ( Gia_ManBufNum(p) )
        Abc_Print( 1, "  buf = %d", Gia_ManBufNum(p) );
    if ( Gia_ManXorNum(p) && p->pMuxes == NULL )
        Abc_Print( 1, "  xor = %d", Gia_ManXorNum(p) );
    if ( pPars && pPars->fMuxXor )
        printf( "\nXOR/MUX " ), Gia_ManPrintMuxStats( p );
    if ( pPars && pPars->fSwitch )
    {
        static int nPiPo = 0;
        static float PrevSwiTotal = 0;
        float SwiTotal = Gia_ManComputeSwitching( p, 48, 16, 0 );
        Abc_Print( 1, "  power =%8.1f", SwiTotal );
        if ( PrevSwiTotal > 0 && nPiPo == Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            Abc_Print( 1, " %6.2f %%", 100.0*(PrevSwiTotal-SwiTotal)/PrevSwiTotal );
        else if ( PrevSwiTotal == 0 || nPiPo != Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            PrevSwiTotal = SwiTotal, nPiPo = Gia_ManCiNum(p) + Gia_ManCoNum(p);
    }
//    Abc_Print( 1, "obj =%5d  ", Gia_ManObjNum(p) );
    Abc_Print( 1, "\n" );

//    Gia_ManSatExperiment( p );
    if ( p->pReprs && p->pNexts )
        Gia_ManEquivPrintClasses( p, 0, 0.0 );
    if ( Gia_ManHasMapping(p) && (pPars == NULL || !pPars->fSkipMap) )
        Gia_ManPrintMappingStats( p, pPars ? pPars->pDumpFile : NULL );
    else if ( pPars && pPars->pDumpFile )
        Gia_ManLogAigStats( p, pPars->pDumpFile );
    if ( pPars && pPars->fNpn && Gia_ManHasMapping(p) && Gia_ManLutSizeMax(p) <= 4 )
        Gia_ManPrintNpnClasses( p );
    if ( p->vPacking )
        Gia_ManPrintPackingStats( p );
    if ( p->vEdge1 )
        Gia_ManPrintEdges( p );
    if ( pPars && pPars->fLutProf && Gia_ManHasMapping(p) )
        Gia_ManPrintLutStats( p );
    if ( p->pPlacement )
        Gia_ManPrintPlacement( p );
//    if ( p->pManTime )
//        Tim_ManPrintStats( (Tim_Man_t *)p->pManTime, p->nAnd2Delay );
    Gia_ManPrintFlopClasses( p );
    Gia_ManPrintGateClasses( p );
    Gia_ManPrintObjClasses( p );
//    if ( p->vRegClasses )
//    {
//        printf( "The design has %d flops with the following class info: ", Vec_IntSize(p->vRegClasses) );
//        Vec_IntPrint( p->vRegClasses );
//    }
    if ( p->vInitClasses )
        Gia_ManPrintInitClasses( p->vInitClasses );
    // check integrity of boxes
    Gia_ManCheckIntegrityWithBoxes( p );
/*
    if ( Gia_ManRegBoxNum(p) )
    {
        int i, Limit = Vec_IntFindMax(p->vRegClasses);
        for ( i = 1; i <= Limit; i++ )
            printf( "%d ", Vec_IntCountEntry(p->vRegClasses, i) );
        printf( "\n" );
    }
*/
    if ( pPars && pPars->fTents )
    {
/*
        int k, Entry, Prev = 1;
        Vec_Int_t * vLimit = Vec_IntAlloc( 1000 );
        Gia_Man_t * pNew = Gia_ManUnrollDup( p, vLimit );
        Abc_Print( 1, "Tents:  " );
        Vec_IntForEachEntryStart( vLimit, Entry, k, 1 )
            Abc_Print( 1, "%d=%d  ", k, Entry-Prev ), Prev = Entry;
        Abc_Print( 1, " Unused=%d.", Gia_ManObjNum(p) - Gia_ManObjNum(pNew) );
        Abc_Print( 1, "\n" );
        Vec_IntFree( vLimit );
        Gia_ManStop( pNew );
*/
        Gia_ManPrintTents( p );
    }
    if ( pPars && pPars->fSlacks )
        Gia_ManDfsSlacksPrint( p );
}